

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PimplImpl.h
# Opt level: O0

void __thiscall
celero::Pimpl<celero::ResultTable::Impl>::Pimpl(Pimpl<celero::ResultTable::Impl> *this)

{
  Impl *this_00;
  Pimpl<celero::ResultTable::Impl> *this_local;
  
  this_00 = (Impl *)operator_new(0x210);
  ResultTable::Impl::Impl(this_00);
  std::unique_ptr<celero::ResultTable::Impl,std::default_delete<celero::ResultTable::Impl>>::
  unique_ptr<std::default_delete<celero::ResultTable::Impl>,void>
            ((unique_ptr<celero::ResultTable::Impl,std::default_delete<celero::ResultTable::Impl>> *
             )this,this_00);
  return;
}

Assistant:

Pimpl<T>::Pimpl() : _pimpl(new T())
	{
	}